

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

unsigned_long
capnp::(anonymous_namespace)::checkRoundTripFromFloat<unsigned_long,double>(double value)

{
  unsigned_long uVar1;
  undefined1 auVar2 [16];
  DebugComparison<double_&,_double> _kjCondition;
  Fault f;
  double value_local;
  
  _kjCondition.right = 0.0;
  _kjCondition.op.content.ptr = " >= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = value >= 0.0;
  _kjCondition.left = &value_local;
  value_local = value;
  if (value < 0.0) {
    uVar1 = 0;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<double&,double>&,char_const(&)[39],double&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x6d8,FAILED,"value >= U(MIN)",
               "_kjCondition,\"Value out-of-range for requested type.\", value",&_kjCondition,
               (char (*) [39])"Value out-of-range for requested type.",&value_local);
  }
  else {
    _kjCondition.right = 1.8446744073709552e+19;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = 1.8446744073709552e+19 >= value;
    if (1.8446744073709552e+19 < value) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<double&,double>&,char_const(&)[39],double&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x6db,FAILED,"value <= U(MAX)",
                 "_kjCondition,\"Value out-of-range for requested type.\", value",&_kjCondition,
                 (char (*) [39])"Value out-of-range for requested type.",&value_local);
      kj::_::Debug::Fault::~Fault(&f);
      uVar1 = 0xffffffffffffffff;
    }
    else {
      uVar1 = 0;
    }
    if (1.8446744073709552e+19 < value) {
      return uVar1;
    }
    uVar1 = (long)(value_local - 9.223372036854776e+18) & (long)value_local >> 0x3f |
            (long)value_local;
    auVar2._8_4_ = (int)(uVar1 >> 0x20);
    auVar2._0_8_ = uVar1;
    auVar2._12_4_ = 0x45300000;
    _kjCondition.left =
         (double *)
         ((auVar2._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    _kjCondition.result = (double)_kjCondition.left == value_local;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if ((value_local == (double)_kjCondition.left) &&
       (!NAN(value_local) && !NAN((double)_kjCondition.left))) {
      return uVar1;
    }
    _kjCondition.right = (double)&value_local;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<double,double&>&,char_const(&)[39],double&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x6df,FAILED,"U(result) == value",
               "_kjCondition,\"Value out-of-range for requested type.\", value",
               (DebugComparison<double,_double_&> *)&_kjCondition,
               (char (*) [39])"Value out-of-range for requested type.",&value_local);
  }
  kj::_::Debug::Fault::~Fault(&f);
  return uVar1;
}

Assistant:

T checkRoundTripFromFloat(U value) {
  // When `U` is `float` or `double`, we have to use a different approach, because casting an
  // out-of-range float to an integer is, surprisingly, UB.
  constexpr T MIN = kj::minValue;
  constexpr T MAX = kj::maxValue;
  KJ_REQUIRE(value >= U(MIN), "Value out-of-range for requested type.", value) {
    return MIN;
  }
  KJ_REQUIRE(value <= U(MAX), "Value out-of-range for requested type.", value) {
    return MAX;
  }
  T result = value;
  KJ_REQUIRE(U(result) == value, "Value out-of-range for requested type.", value) {
    // Use it anyway.
    break;
  }
  return result;
}